

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_sse2(__m128i *input,__m128i *output)

{
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  int iVar144;
  int iVar154;
  int iVar155;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  int iVar156;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [16];
  __m128i cospi_p06_m58;
  __m128i cospi_p58_p06;
  __m128i cospi_p14_m50;
  __m128i cospi_p50_p14;
  __m128i cospi_p22_m42;
  __m128i cospi_p42_p22;
  __m128i cospi_p30_m34;
  __m128i cospi_p34_p30;
  __m128i cospi_p38_m26;
  __m128i cospi_p26_p38;
  __m128i cospi_p46_m18;
  __m128i cospi_p18_p46;
  __m128i cospi_p54_m10;
  __m128i cospi_p10_p54;
  __m128i cospi_p62_m02;
  __m128i cospi_p02_p62;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  __m128i *x_00;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  int8_t cos_bit_00;
  undefined8 uVar157;
  undefined7 uVar158;
  int8_t cos_bit_01;
  longlong lVar159;
  int32_t *cospi_00;
  __m128i *x_01;
  undefined8 uStack_1850;
  undefined1 uStack_1842;
  int8_t cos_bit_02;
  undefined2 uVar160;
  undefined2 uVar161;
  undefined2 uVar162;
  undefined2 uVar163;
  undefined2 uVar164;
  undefined2 uVar165;
  undefined2 uVar166;
  undefined2 uVar167;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  __m128i local_14a8;
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  undefined1 local_1478 [16];
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  int32_t *local_1290;
  undefined1 local_1281;
  __m128i *local_1280;
  undefined8 *local_1278;
  int local_126c;
  uint local_1268;
  int local_1264;
  uint local_1260;
  int local_125c;
  uint local_1258;
  int local_1254;
  uint local_1250;
  int local_124c;
  uint local_1248;
  int local_1244;
  uint local_1240;
  int local_123c;
  uint local_1238;
  int local_1234;
  uint local_1230;
  undefined4 local_122c;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined4 local_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined4 local_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined4 local_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined4 local_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined4 local_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined4 local_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined4 local_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined4 local_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined4 local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined4 local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined4 local_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined4 local_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined4 local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined4 local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined4 local_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined4 local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined4 local_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined4 local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined4 local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 local_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 local_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined4 local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 local_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_1281 = 0xc;
  local_1280 = in_RSI;
  local_1278 = in_RDI;
  local_1290 = cospi_arr(0xc);
  local_122c = 0x800;
  local_20c = 0x800;
  local_210 = 0x800;
  local_214 = 0x800;
  local_218 = 0x800;
  local_12a8 = 0x80000000800;
  uStack_12a0 = 0x80000000800;
  local_1230 = (uint)*(ushort *)(local_1290 + 2) | local_1290[0x3e] << 0x10;
  local_12b8 = CONCAT44(local_1230,local_1230);
  uStack_12b0 = CONCAT44(local_1230,local_1230);
  local_1234 = (uint)*(ushort *)(local_1290 + 0x3e) + local_1290[2] * -0x10000;
  local_12c8 = CONCAT44(local_1234,local_1234);
  uStack_12c0 = CONCAT44(local_1234,local_1234);
  local_1238 = (uint)*(ushort *)(local_1290 + 10) | local_1290[0x36] << 0x10;
  local_12d8 = CONCAT44(local_1238,local_1238);
  uStack_12d0 = CONCAT44(local_1238,local_1238);
  local_123c = (uint)*(ushort *)(local_1290 + 0x36) + local_1290[10] * -0x10000;
  local_12e8 = CONCAT44(local_123c,local_123c);
  uStack_12e0 = CONCAT44(local_123c,local_123c);
  local_1240 = (uint)*(ushort *)(local_1290 + 0x12) | local_1290[0x2e] << 0x10;
  local_12f8 = CONCAT44(local_1240,local_1240);
  uStack_12f0 = CONCAT44(local_1240,local_1240);
  local_1244 = (uint)*(ushort *)(local_1290 + 0x2e) + local_1290[0x12] * -0x10000;
  local_1308 = CONCAT44(local_1244,local_1244);
  uStack_1300 = CONCAT44(local_1244,local_1244);
  local_1248 = (uint)*(ushort *)(local_1290 + 0x1a) | local_1290[0x26] << 0x10;
  local_1318 = CONCAT44(local_1248,local_1248);
  uStack_1310 = CONCAT44(local_1248,local_1248);
  local_124c = (uint)*(ushort *)(local_1290 + 0x26) + local_1290[0x1a] * -0x10000;
  local_1328 = CONCAT44(local_124c,local_124c);
  uStack_1320 = CONCAT44(local_124c,local_124c);
  local_1250 = (uint)*(ushort *)(local_1290 + 0x22) | local_1290[0x1e] << 0x10;
  local_1338 = CONCAT44(local_1250,local_1250);
  uStack_1330 = CONCAT44(local_1250,local_1250);
  local_1254 = (uint)*(ushort *)(local_1290 + 0x1e) + local_1290[0x22] * -0x10000;
  local_1348 = CONCAT44(local_1254,local_1254);
  uStack_1340 = CONCAT44(local_1254,local_1254);
  local_1258 = (uint)*(ushort *)(local_1290 + 0x2a) | local_1290[0x16] << 0x10;
  local_1358 = CONCAT44(local_1258,local_1258);
  uStack_1350 = CONCAT44(local_1258,local_1258);
  local_125c = (uint)*(ushort *)(local_1290 + 0x16) + local_1290[0x2a] * -0x10000;
  local_1368 = CONCAT44(local_125c,local_125c);
  uStack_1360 = CONCAT44(local_125c,local_125c);
  local_1260 = (uint)*(ushort *)(local_1290 + 0x32) | local_1290[0xe] << 0x10;
  local_1378 = CONCAT44(local_1260,local_1260);
  uStack_1370 = CONCAT44(local_1260,local_1260);
  local_1264 = (uint)*(ushort *)(local_1290 + 0xe) + local_1290[0x32] * -0x10000;
  local_1388 = CONCAT44(local_1264,local_1264);
  uStack_1380 = CONCAT44(local_1264,local_1264);
  local_1268 = (uint)*(ushort *)(local_1290 + 0x3a) | local_1290[6] << 0x10;
  local_1398 = CONCAT44(local_1268,local_1268);
  uStack_1390 = CONCAT44(local_1268,local_1268);
  local_126c = (uint)*(ushort *)(local_1290 + 6) + local_1290[0x3a] * -0x10000;
  local_13a8 = CONCAT44(local_126c,local_126c);
  uStack_13a0 = CONCAT44(local_126c,local_126c);
  local_1038 = local_1278[0x1e];
  uStack_1130 = local_1278[0x1f];
  local_1048 = *local_1278;
  uStack_1140 = local_1278[1];
  local_1058 = local_1278[0x1a];
  uStack_1150 = local_1278[0x1b];
  local_1068 = local_1278[4];
  uStack_1160 = local_1278[5];
  local_1078 = local_1278[0x16];
  uStack_1170 = local_1278[0x17];
  local_1088 = local_1278[8];
  uStack_1180 = local_1278[9];
  local_1098 = local_1278[0x12];
  uStack_1190 = local_1278[0x13];
  local_10a8 = local_1278[0xc];
  uStack_11a0 = local_1278[0xd];
  local_10b8 = local_1278[0xe];
  uStack_11b0 = local_1278[0xf];
  local_10c8 = local_1278[0x10];
  uStack_11c0 = local_1278[0x11];
  local_10d8 = local_1278[10];
  uStack_11d0 = local_1278[0xb];
  local_10e8 = local_1278[0x14];
  uStack_11e0 = local_1278[0x15];
  local_10f8 = local_1278[6];
  uStack_11f0 = local_1278[7];
  local_1108 = local_1278[0x18];
  uStack_1200 = local_1278[0x19];
  local_1118 = local_1278[2];
  uStack_1210 = local_1278[3];
  local_1128 = local_1278[0x1c];
  uStack_1220 = local_1278[0x1d];
  local_1138._0_2_ = (undefined2)local_1038;
  local_1138._2_2_ = (undefined2)((ulong)local_1038 >> 0x10);
  local_1138._4_2_ = (undefined2)((ulong)local_1038 >> 0x20);
  local_1138._6_2_ = (undefined2)((ulong)local_1038 >> 0x30);
  local_1148._0_2_ = (undefined2)local_1048;
  local_1148._2_2_ = (undefined2)((ulong)local_1048 >> 0x10);
  local_1148._4_2_ = (undefined2)((ulong)local_1048 >> 0x20);
  local_1148._6_2_ = (undefined2)((ulong)local_1048 >> 0x30);
  uStack_1030._0_2_ = (undefined2)uStack_1130;
  uStack_1030._2_2_ = (undefined2)((ulong)uStack_1130 >> 0x10);
  uStack_1030._4_2_ = (undefined2)((ulong)uStack_1130 >> 0x20);
  uStack_1030._6_2_ = (undefined2)((ulong)uStack_1130 >> 0x30);
  uStack_1040._0_2_ = (undefined2)uStack_1140;
  uStack_1040._2_2_ = (undefined2)((ulong)uStack_1140 >> 0x10);
  uStack_1040._4_2_ = (undefined2)((ulong)uStack_1140 >> 0x20);
  uStack_1040._6_2_ = (undefined2)((ulong)uStack_1140 >> 0x30);
  local_c38 = CONCAT26(local_1148._2_2_,
                       CONCAT24(local_1138._2_2_,
                                CONCAT22((undefined2)local_1148,(undefined2)local_1138)));
  uStack_c30 = CONCAT26(local_1148._6_2_,
                        CONCAT24(local_1138._6_2_,CONCAT22(local_1148._4_2_,local_1138._4_2_)));
  auVar55._8_8_ = uStack_c30;
  auVar55._0_8_ = local_c38;
  auVar54._8_8_ = uStack_12b0;
  auVar54._0_8_ = local_12b8;
  auVar145 = pmaddwd(auVar55,auVar54);
  local_c58 = CONCAT26(uStack_1040._2_2_,
                       CONCAT24(uStack_1030._2_2_,
                                CONCAT22((undefined2)uStack_1040,(undefined2)uStack_1030)));
  uStack_c50 = CONCAT26(uStack_1040._6_2_,
                        CONCAT24(uStack_1030._6_2_,CONCAT22(uStack_1040._4_2_,uStack_1030._4_2_)));
  auVar53._8_8_ = uStack_c50;
  auVar53._0_8_ = local_c58;
  auVar52._8_8_ = uStack_12b0;
  auVar52._0_8_ = local_12b8;
  auVar146 = pmaddwd(auVar53,auVar52);
  local_c78 = CONCAT26(local_1148._2_2_,
                       CONCAT24(local_1138._2_2_,
                                CONCAT22((undefined2)local_1148,(undefined2)local_1138)));
  uStack_c70 = CONCAT26(local_1148._6_2_,
                        CONCAT24(local_1138._6_2_,CONCAT22(local_1148._4_2_,local_1138._4_2_)));
  auVar51._8_8_ = uStack_c70;
  auVar51._0_8_ = local_c78;
  auVar50._8_8_ = uStack_12c0;
  auVar50._0_8_ = local_12c8;
  auVar147 = pmaddwd(auVar51,auVar50);
  local_c98 = CONCAT26(uStack_1040._2_2_,
                       CONCAT24(uStack_1030._2_2_,
                                CONCAT22((undefined2)uStack_1040,(undefined2)uStack_1030)));
  uStack_c90 = CONCAT26(uStack_1040._6_2_,
                        CONCAT24(uStack_1030._6_2_,CONCAT22(uStack_1040._4_2_,uStack_1030._4_2_)));
  auVar49._8_8_ = uStack_c90;
  auVar49._0_8_ = local_c98;
  auVar48._8_8_ = uStack_12c0;
  auVar48._0_8_ = local_12c8;
  auVar148 = pmaddwd(auVar49,auVar48);
  local_14d8 = auVar145._0_8_;
  uStack_14d0 = auVar145._8_8_;
  local_838 = local_14d8;
  uVar142 = local_838;
  uStack_830 = uStack_14d0;
  uVar143 = uStack_830;
  local_838._0_4_ = auVar145._0_4_;
  local_838._4_4_ = auVar145._4_4_;
  uStack_830._0_4_ = auVar145._8_4_;
  uStack_830._4_4_ = auVar145._12_4_;
  local_14e8 = auVar146._0_8_;
  uStack_14e0 = auVar146._8_8_;
  local_858 = local_14e8;
  uVar140 = local_858;
  uStack_850 = uStack_14e0;
  uVar141 = uStack_850;
  local_858._0_4_ = auVar146._0_4_;
  local_858._4_4_ = auVar146._4_4_;
  uStack_850._0_4_ = auVar146._8_4_;
  uStack_850._4_4_ = auVar146._12_4_;
  local_14f8 = auVar147._0_8_;
  uStack_14f0 = auVar147._8_8_;
  local_878 = local_14f8;
  uVar138 = local_878;
  uStack_870 = uStack_14f0;
  uVar139 = uStack_870;
  local_878._0_4_ = auVar147._0_4_;
  local_878._4_4_ = auVar147._4_4_;
  uStack_870._0_4_ = auVar147._8_4_;
  uStack_870._4_4_ = auVar147._12_4_;
  local_1508 = auVar148._0_8_;
  uStack_1500 = auVar148._8_8_;
  local_898 = local_1508;
  uVar136 = local_898;
  uStack_890 = uStack_1500;
  uVar137 = uStack_890;
  local_898._0_4_ = auVar148._0_4_;
  local_898._4_4_ = auVar148._4_4_;
  uStack_890._0_4_ = auVar148._8_4_;
  uStack_890._4_4_ = auVar148._12_4_;
  local_438 = CONCAT44(local_838._4_4_ + 0x800,(int)local_838 + 0x800);
  uStack_430 = CONCAT44(uStack_830._4_4_ + 0x800,(int)uStack_830 + 0x800);
  local_43c = 0xc;
  auVar145 = ZEXT416(0xc);
  local_458 = CONCAT44(local_858._4_4_ + 0x800,(int)local_858 + 0x800);
  uStack_450 = CONCAT44(uStack_850._4_4_ + 0x800,(int)uStack_850 + 0x800);
  local_45c = 0xc;
  auVar146 = ZEXT416(0xc);
  local_478 = CONCAT44(local_878._4_4_ + 0x800,(int)local_878 + 0x800);
  uStack_470 = CONCAT44(uStack_870._4_4_ + 0x800,(int)uStack_870 + 0x800);
  local_47c = 0xc;
  auVar147 = ZEXT416(0xc);
  local_498 = CONCAT44(local_898._4_4_ + 0x800,(int)local_898 + 0x800);
  uStack_490 = CONCAT44(uStack_890._4_4_ + 0x800,(int)uStack_890 + 0x800);
  local_49c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_238 = CONCAT44(local_838._4_4_ + 0x800 >> auVar145,(int)local_838 + 0x800 >> auVar145);
  uStack_230 = CONCAT44(uStack_830._4_4_ + 0x800 >> auVar145,(int)uStack_830 + 0x800 >> auVar145);
  local_248 = CONCAT44(local_858._4_4_ + 0x800 >> auVar146,(int)local_858 + 0x800 >> auVar146);
  uStack_240 = CONCAT44(uStack_850._4_4_ + 0x800 >> auVar146,(int)uStack_850 + 0x800 >> auVar146);
  auVar87._8_8_ = uStack_230;
  auVar87._0_8_ = local_238;
  auVar86._8_8_ = uStack_240;
  auVar86._0_8_ = local_248;
  local_14a8 = (__m128i)packssdw(auVar87,auVar86);
  local_258 = CONCAT44(local_878._4_4_ + 0x800 >> auVar147,(int)local_878 + 0x800 >> auVar147);
  uStack_250 = CONCAT44(uStack_870._4_4_ + 0x800 >> auVar147,(int)uStack_870 + 0x800 >> auVar147);
  local_268 = CONCAT44(local_898._4_4_ + 0x800 >> auVar148,(int)local_898 + 0x800 >> auVar148);
  uStack_260 = CONCAT44(uStack_890._4_4_ + 0x800 >> auVar148,(int)uStack_890 + 0x800 >> auVar148);
  auVar85._8_8_ = uStack_250;
  auVar85._0_8_ = local_258;
  auVar84._8_8_ = uStack_260;
  auVar84._0_8_ = local_268;
  local_1498 = packssdw(auVar85,auVar84);
  local_1158._0_2_ = (undefined2)local_1058;
  local_1158._2_2_ = (undefined2)((ulong)local_1058 >> 0x10);
  local_1158._4_2_ = (undefined2)((ulong)local_1058 >> 0x20);
  local_1158._6_2_ = (undefined2)((ulong)local_1058 >> 0x30);
  local_1168._0_2_ = (undefined2)local_1068;
  local_1168._2_2_ = (undefined2)((ulong)local_1068 >> 0x10);
  local_1168._4_2_ = (undefined2)((ulong)local_1068 >> 0x20);
  local_1168._6_2_ = (undefined2)((ulong)local_1068 >> 0x30);
  uStack_1050._0_2_ = (undefined2)uStack_1150;
  uStack_1050._2_2_ = (undefined2)((ulong)uStack_1150 >> 0x10);
  uStack_1050._4_2_ = (undefined2)((ulong)uStack_1150 >> 0x20);
  uStack_1050._6_2_ = (undefined2)((ulong)uStack_1150 >> 0x30);
  uStack_1060._0_2_ = (undefined2)uStack_1160;
  uStack_1060._2_2_ = (undefined2)((ulong)uStack_1160 >> 0x10);
  uStack_1060._4_2_ = (undefined2)((ulong)uStack_1160 >> 0x20);
  uStack_1060._6_2_ = (undefined2)((ulong)uStack_1160 >> 0x30);
  local_cb8 = CONCAT26(local_1168._2_2_,
                       CONCAT24(local_1158._2_2_,
                                CONCAT22((undefined2)local_1168,(undefined2)local_1158)));
  uStack_cb0 = CONCAT26(local_1168._6_2_,
                        CONCAT24(local_1158._6_2_,CONCAT22(local_1168._4_2_,local_1158._4_2_)));
  auVar47._8_8_ = uStack_cb0;
  auVar47._0_8_ = local_cb8;
  auVar46._8_8_ = uStack_12d0;
  auVar46._0_8_ = local_12d8;
  auVar145 = pmaddwd(auVar47,auVar46);
  local_cd8 = CONCAT26(uStack_1060._2_2_,
                       CONCAT24(uStack_1050._2_2_,
                                CONCAT22((undefined2)uStack_1060,(undefined2)uStack_1050)));
  uStack_cd0 = CONCAT26(uStack_1060._6_2_,
                        CONCAT24(uStack_1050._6_2_,CONCAT22(uStack_1060._4_2_,uStack_1050._4_2_)));
  auVar45._8_8_ = uStack_cd0;
  auVar45._0_8_ = local_cd8;
  auVar44._8_8_ = uStack_12d0;
  auVar44._0_8_ = local_12d8;
  auVar146 = pmaddwd(auVar45,auVar44);
  local_cf8 = CONCAT26(local_1168._2_2_,
                       CONCAT24(local_1158._2_2_,
                                CONCAT22((undefined2)local_1168,(undefined2)local_1158)));
  uStack_cf0 = CONCAT26(local_1168._6_2_,
                        CONCAT24(local_1158._6_2_,CONCAT22(local_1168._4_2_,local_1158._4_2_)));
  auVar43._8_8_ = uStack_cf0;
  auVar43._0_8_ = local_cf8;
  auVar42._8_8_ = uStack_12e0;
  auVar42._0_8_ = local_12e8;
  auVar147 = pmaddwd(auVar43,auVar42);
  local_d18 = CONCAT26(uStack_1060._2_2_,
                       CONCAT24(uStack_1050._2_2_,
                                CONCAT22((undefined2)uStack_1060,(undefined2)uStack_1050)));
  uStack_d10 = CONCAT26(uStack_1060._6_2_,
                        CONCAT24(uStack_1050._6_2_,CONCAT22(uStack_1060._4_2_,uStack_1050._4_2_)));
  auVar41._8_8_ = uStack_d10;
  auVar41._0_8_ = local_d18;
  auVar40._8_8_ = uStack_12e0;
  auVar40._0_8_ = local_12e8;
  auVar148 = pmaddwd(auVar41,auVar40);
  local_15b8 = auVar145._0_8_;
  uStack_15b0 = auVar145._8_8_;
  local_8b8 = local_15b8;
  uVar134 = local_8b8;
  uStack_8b0 = uStack_15b0;
  uVar135 = uStack_8b0;
  local_8b8._0_4_ = auVar145._0_4_;
  local_8b8._4_4_ = auVar145._4_4_;
  uStack_8b0._0_4_ = auVar145._8_4_;
  uStack_8b0._4_4_ = auVar145._12_4_;
  local_15c8 = auVar146._0_8_;
  uStack_15c0 = auVar146._8_8_;
  local_8d8 = local_15c8;
  uVar132 = local_8d8;
  uStack_8d0 = uStack_15c0;
  uVar133 = uStack_8d0;
  local_8d8._0_4_ = auVar146._0_4_;
  local_8d8._4_4_ = auVar146._4_4_;
  uStack_8d0._0_4_ = auVar146._8_4_;
  uStack_8d0._4_4_ = auVar146._12_4_;
  local_15d8 = auVar147._0_8_;
  uStack_15d0 = auVar147._8_8_;
  local_8f8 = local_15d8;
  uVar130 = local_8f8;
  uStack_8f0 = uStack_15d0;
  uVar131 = uStack_8f0;
  local_8f8._0_4_ = auVar147._0_4_;
  local_8f8._4_4_ = auVar147._4_4_;
  uStack_8f0._0_4_ = auVar147._8_4_;
  uStack_8f0._4_4_ = auVar147._12_4_;
  local_15e8 = auVar148._0_8_;
  uStack_15e0 = auVar148._8_8_;
  local_918 = local_15e8;
  uVar128 = local_918;
  uStack_910 = uStack_15e0;
  uVar129 = uStack_910;
  local_918._0_4_ = auVar148._0_4_;
  local_918._4_4_ = auVar148._4_4_;
  uStack_910._0_4_ = auVar148._8_4_;
  uStack_910._4_4_ = auVar148._12_4_;
  local_4b8 = CONCAT44(local_8b8._4_4_ + 0x800,(int)local_8b8 + 0x800);
  uStack_4b0 = CONCAT44(uStack_8b0._4_4_ + 0x800,(int)uStack_8b0 + 0x800);
  local_4bc = 0xc;
  auVar145 = ZEXT416(0xc);
  local_4d8 = CONCAT44(local_8d8._4_4_ + 0x800,(int)local_8d8 + 0x800);
  uStack_4d0 = CONCAT44(uStack_8d0._4_4_ + 0x800,(int)uStack_8d0 + 0x800);
  local_4dc = 0xc;
  auVar146 = ZEXT416(0xc);
  local_4f8 = CONCAT44(local_8f8._4_4_ + 0x800,(int)local_8f8 + 0x800);
  uStack_4f0 = CONCAT44(uStack_8f0._4_4_ + 0x800,(int)uStack_8f0 + 0x800);
  local_4fc = 0xc;
  auVar147 = ZEXT416(0xc);
  local_518 = CONCAT44(local_918._4_4_ + 0x800,(int)local_918 + 0x800);
  uStack_510 = CONCAT44(uStack_910._4_4_ + 0x800,(int)uStack_910 + 0x800);
  local_51c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_278 = CONCAT44(local_8b8._4_4_ + 0x800 >> auVar145,(int)local_8b8 + 0x800 >> auVar145);
  uStack_270 = CONCAT44(uStack_8b0._4_4_ + 0x800 >> auVar145,(int)uStack_8b0 + 0x800 >> auVar145);
  local_288 = CONCAT44(local_8d8._4_4_ + 0x800 >> auVar146,(int)local_8d8 + 0x800 >> auVar146);
  uStack_280 = CONCAT44(uStack_8d0._4_4_ + 0x800 >> auVar146,(int)uStack_8d0 + 0x800 >> auVar146);
  auVar83._8_8_ = uStack_270;
  auVar83._0_8_ = local_278;
  auVar82._8_8_ = uStack_280;
  auVar82._0_8_ = local_288;
  local_1488 = packssdw(auVar83,auVar82);
  local_298 = CONCAT44(local_8f8._4_4_ + 0x800 >> auVar147,(int)local_8f8 + 0x800 >> auVar147);
  uStack_290 = CONCAT44(uStack_8f0._4_4_ + 0x800 >> auVar147,(int)uStack_8f0 + 0x800 >> auVar147);
  local_2a8 = CONCAT44(local_918._4_4_ + 0x800 >> auVar148,(int)local_918 + 0x800 >> auVar148);
  uStack_2a0 = CONCAT44(uStack_910._4_4_ + 0x800 >> auVar148,(int)uStack_910 + 0x800 >> auVar148);
  auVar81._8_8_ = uStack_290;
  auVar81._0_8_ = local_298;
  auVar80._8_8_ = uStack_2a0;
  auVar80._0_8_ = local_2a8;
  local_1478 = packssdw(auVar81,auVar80);
  local_1178._0_2_ = (undefined2)local_1078;
  local_1178._2_2_ = (undefined2)((ulong)local_1078 >> 0x10);
  local_1178._4_2_ = (undefined2)((ulong)local_1078 >> 0x20);
  local_1178._6_2_ = (undefined2)((ulong)local_1078 >> 0x30);
  local_1188._0_2_ = (undefined2)local_1088;
  local_1188._2_2_ = (undefined2)((ulong)local_1088 >> 0x10);
  local_1188._4_2_ = (undefined2)((ulong)local_1088 >> 0x20);
  local_1188._6_2_ = (undefined2)((ulong)local_1088 >> 0x30);
  uStack_1070._0_2_ = (undefined2)uStack_1170;
  uStack_1070._2_2_ = (undefined2)((ulong)uStack_1170 >> 0x10);
  uStack_1070._4_2_ = (undefined2)((ulong)uStack_1170 >> 0x20);
  uStack_1070._6_2_ = (undefined2)((ulong)uStack_1170 >> 0x30);
  uStack_1080._0_2_ = (undefined2)uStack_1180;
  uStack_1080._2_2_ = (undefined2)((ulong)uStack_1180 >> 0x10);
  uStack_1080._4_2_ = (undefined2)((ulong)uStack_1180 >> 0x20);
  uStack_1080._6_2_ = (undefined2)((ulong)uStack_1180 >> 0x30);
  local_d38 = CONCAT26(local_1188._2_2_,
                       CONCAT24(local_1178._2_2_,
                                CONCAT22((undefined2)local_1188,(undefined2)local_1178)));
  uStack_d30 = CONCAT26(local_1188._6_2_,
                        CONCAT24(local_1178._6_2_,CONCAT22(local_1188._4_2_,local_1178._4_2_)));
  auVar39._8_8_ = uStack_d30;
  auVar39._0_8_ = local_d38;
  auVar38._8_8_ = uStack_12f0;
  auVar38._0_8_ = local_12f8;
  auVar145 = pmaddwd(auVar39,auVar38);
  local_d58 = CONCAT26(uStack_1080._2_2_,
                       CONCAT24(uStack_1070._2_2_,
                                CONCAT22((undefined2)uStack_1080,(undefined2)uStack_1070)));
  uStack_d50 = CONCAT26(uStack_1080._6_2_,
                        CONCAT24(uStack_1070._6_2_,CONCAT22(uStack_1080._4_2_,uStack_1070._4_2_)));
  auVar37._8_8_ = uStack_d50;
  auVar37._0_8_ = local_d58;
  auVar36._8_8_ = uStack_12f0;
  auVar36._0_8_ = local_12f8;
  auVar146 = pmaddwd(auVar37,auVar36);
  local_d78 = CONCAT26(local_1188._2_2_,
                       CONCAT24(local_1178._2_2_,
                                CONCAT22((undefined2)local_1188,(undefined2)local_1178)));
  uStack_d70 = CONCAT26(local_1188._6_2_,
                        CONCAT24(local_1178._6_2_,CONCAT22(local_1188._4_2_,local_1178._4_2_)));
  auVar35._8_8_ = uStack_d70;
  auVar35._0_8_ = local_d78;
  auVar34._8_8_ = uStack_1300;
  auVar34._0_8_ = local_1308;
  auVar147 = pmaddwd(auVar35,auVar34);
  local_d98 = CONCAT26(uStack_1080._2_2_,
                       CONCAT24(uStack_1070._2_2_,
                                CONCAT22((undefined2)uStack_1080,(undefined2)uStack_1070)));
  uStack_d90 = CONCAT26(uStack_1080._6_2_,
                        CONCAT24(uStack_1070._6_2_,CONCAT22(uStack_1080._4_2_,uStack_1070._4_2_)));
  auVar33._8_8_ = uStack_d90;
  auVar33._0_8_ = local_d98;
  auVar32._8_8_ = uStack_1300;
  auVar32._0_8_ = local_1308;
  auVar148 = pmaddwd(auVar33,auVar32);
  local_1698 = auVar145._0_8_;
  uStack_1690 = auVar145._8_8_;
  local_938 = local_1698;
  uVar126 = local_938;
  uStack_930 = uStack_1690;
  uVar127 = uStack_930;
  local_938._0_4_ = auVar145._0_4_;
  local_938._4_4_ = auVar145._4_4_;
  uStack_930._0_4_ = auVar145._8_4_;
  uStack_930._4_4_ = auVar145._12_4_;
  local_16a8 = auVar146._0_8_;
  uStack_16a0 = auVar146._8_8_;
  local_958 = local_16a8;
  uVar124 = local_958;
  uStack_950 = uStack_16a0;
  uVar125 = uStack_950;
  local_958._0_4_ = auVar146._0_4_;
  local_958._4_4_ = auVar146._4_4_;
  uStack_950._0_4_ = auVar146._8_4_;
  uStack_950._4_4_ = auVar146._12_4_;
  local_16b8 = auVar147._0_8_;
  uStack_16b0 = auVar147._8_8_;
  local_978 = local_16b8;
  uVar122 = local_978;
  uStack_970 = uStack_16b0;
  uVar123 = uStack_970;
  local_978._0_4_ = auVar147._0_4_;
  local_978._4_4_ = auVar147._4_4_;
  uStack_970._0_4_ = auVar147._8_4_;
  uStack_970._4_4_ = auVar147._12_4_;
  local_16c8 = auVar148._0_8_;
  uStack_16c0 = auVar148._8_8_;
  local_998 = local_16c8;
  uVar120 = local_998;
  uStack_990 = uStack_16c0;
  uVar121 = uStack_990;
  local_998._0_4_ = auVar148._0_4_;
  local_998._4_4_ = auVar148._4_4_;
  uStack_990._0_4_ = auVar148._8_4_;
  uStack_990._4_4_ = auVar148._12_4_;
  local_538 = CONCAT44(local_938._4_4_ + 0x800,(int)local_938 + 0x800);
  uStack_530 = CONCAT44(uStack_930._4_4_ + 0x800,(int)uStack_930 + 0x800);
  local_53c = 0xc;
  auVar145 = ZEXT416(0xc);
  local_558 = CONCAT44(local_958._4_4_ + 0x800,(int)local_958 + 0x800);
  uStack_550 = CONCAT44(uStack_950._4_4_ + 0x800,(int)uStack_950 + 0x800);
  local_55c = 0xc;
  auVar146 = ZEXT416(0xc);
  local_578 = CONCAT44(local_978._4_4_ + 0x800,(int)local_978 + 0x800);
  uStack_570 = CONCAT44(uStack_970._4_4_ + 0x800,(int)uStack_970 + 0x800);
  local_57c = 0xc;
  auVar147 = ZEXT416(0xc);
  local_598 = CONCAT44(local_998._4_4_ + 0x800,(int)local_998 + 0x800);
  uStack_590 = CONCAT44(uStack_990._4_4_ + 0x800,(int)uStack_990 + 0x800);
  local_59c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_2b8 = CONCAT44(local_938._4_4_ + 0x800 >> auVar145,(int)local_938 + 0x800 >> auVar145);
  uStack_2b0 = CONCAT44(uStack_930._4_4_ + 0x800 >> auVar145,(int)uStack_930 + 0x800 >> auVar145);
  local_2c8 = CONCAT44(local_958._4_4_ + 0x800 >> auVar146,(int)local_958 + 0x800 >> auVar146);
  uStack_2c0 = CONCAT44(uStack_950._4_4_ + 0x800 >> auVar146,(int)uStack_950 + 0x800 >> auVar146);
  auVar79._8_8_ = uStack_2b0;
  auVar79._0_8_ = local_2b8;
  auVar78._8_8_ = uStack_2c0;
  auVar78._0_8_ = local_2c8;
  local_1468 = packssdw(auVar79,auVar78);
  local_2d8 = CONCAT44(local_978._4_4_ + 0x800 >> auVar147,(int)local_978 + 0x800 >> auVar147);
  uStack_2d0 = CONCAT44(uStack_970._4_4_ + 0x800 >> auVar147,(int)uStack_970 + 0x800 >> auVar147);
  local_2e8 = CONCAT44(local_998._4_4_ + 0x800 >> auVar148,(int)local_998 + 0x800 >> auVar148);
  uStack_2e0 = CONCAT44(uStack_990._4_4_ + 0x800 >> auVar148,(int)uStack_990 + 0x800 >> auVar148);
  auVar77._8_8_ = uStack_2d0;
  auVar77._0_8_ = local_2d8;
  auVar76._8_8_ = uStack_2e0;
  auVar76._0_8_ = local_2e8;
  local_1458 = packssdw(auVar77,auVar76);
  local_1198._0_2_ = (undefined2)local_1098;
  local_1198._2_2_ = (undefined2)((ulong)local_1098 >> 0x10);
  local_1198._4_2_ = (undefined2)((ulong)local_1098 >> 0x20);
  local_1198._6_2_ = (undefined2)((ulong)local_1098 >> 0x30);
  local_11a8._0_2_ = (undefined2)local_10a8;
  local_11a8._2_2_ = (undefined2)((ulong)local_10a8 >> 0x10);
  local_11a8._4_2_ = (undefined2)((ulong)local_10a8 >> 0x20);
  local_11a8._6_2_ = (undefined2)((ulong)local_10a8 >> 0x30);
  uStack_1090._0_2_ = (undefined2)uStack_1190;
  uStack_1090._2_2_ = (undefined2)((ulong)uStack_1190 >> 0x10);
  uStack_1090._4_2_ = (undefined2)((ulong)uStack_1190 >> 0x20);
  uStack_1090._6_2_ = (undefined2)((ulong)uStack_1190 >> 0x30);
  uStack_10a0._0_2_ = (undefined2)uStack_11a0;
  uStack_10a0._2_2_ = (undefined2)((ulong)uStack_11a0 >> 0x10);
  uStack_10a0._4_2_ = (undefined2)((ulong)uStack_11a0 >> 0x20);
  uStack_10a0._6_2_ = (undefined2)((ulong)uStack_11a0 >> 0x30);
  local_db8 = CONCAT26(local_11a8._2_2_,
                       CONCAT24(local_1198._2_2_,
                                CONCAT22((undefined2)local_11a8,(undefined2)local_1198)));
  uStack_db0 = CONCAT26(local_11a8._6_2_,
                        CONCAT24(local_1198._6_2_,CONCAT22(local_11a8._4_2_,local_1198._4_2_)));
  auVar31._8_8_ = uStack_db0;
  auVar31._0_8_ = local_db8;
  auVar30._8_8_ = uStack_1310;
  auVar30._0_8_ = local_1318;
  auVar145 = pmaddwd(auVar31,auVar30);
  local_dd8 = CONCAT26(uStack_10a0._2_2_,
                       CONCAT24(uStack_1090._2_2_,
                                CONCAT22((undefined2)uStack_10a0,(undefined2)uStack_1090)));
  uStack_dd0 = CONCAT26(uStack_10a0._6_2_,
                        CONCAT24(uStack_1090._6_2_,CONCAT22(uStack_10a0._4_2_,uStack_1090._4_2_)));
  auVar29._8_8_ = uStack_dd0;
  auVar29._0_8_ = local_dd8;
  auVar28._8_8_ = uStack_1310;
  auVar28._0_8_ = local_1318;
  auVar146 = pmaddwd(auVar29,auVar28);
  local_df8 = CONCAT26(local_11a8._2_2_,
                       CONCAT24(local_1198._2_2_,
                                CONCAT22((undefined2)local_11a8,(undefined2)local_1198)));
  uStack_df0 = CONCAT26(local_11a8._6_2_,
                        CONCAT24(local_1198._6_2_,CONCAT22(local_11a8._4_2_,local_1198._4_2_)));
  auVar27._8_8_ = uStack_df0;
  auVar27._0_8_ = local_df8;
  auVar26._8_8_ = uStack_1320;
  auVar26._0_8_ = local_1328;
  auVar147 = pmaddwd(auVar27,auVar26);
  local_e18 = CONCAT26(uStack_10a0._2_2_,
                       CONCAT24(uStack_1090._2_2_,
                                CONCAT22((undefined2)uStack_10a0,(undefined2)uStack_1090)));
  uStack_e10 = CONCAT26(uStack_10a0._6_2_,
                        CONCAT24(uStack_1090._6_2_,CONCAT22(uStack_10a0._4_2_,uStack_1090._4_2_)));
  auVar25._8_8_ = uStack_e10;
  auVar25._0_8_ = local_e18;
  auVar24._8_8_ = uStack_1320;
  auVar24._0_8_ = local_1328;
  auVar148 = pmaddwd(auVar25,auVar24);
  local_1778 = auVar145._0_8_;
  uStack_1770 = auVar145._8_8_;
  local_9b8 = local_1778;
  uVar118 = local_9b8;
  uStack_9b0 = uStack_1770;
  uVar119 = uStack_9b0;
  local_9b8._0_4_ = auVar145._0_4_;
  local_9b8._4_4_ = auVar145._4_4_;
  uStack_9b0._0_4_ = auVar145._8_4_;
  uStack_9b0._4_4_ = auVar145._12_4_;
  local_1788 = auVar146._0_8_;
  uStack_1780 = auVar146._8_8_;
  local_9d8 = local_1788;
  uVar116 = local_9d8;
  uStack_9d0 = uStack_1780;
  uVar117 = uStack_9d0;
  local_9d8._0_4_ = auVar146._0_4_;
  local_9d8._4_4_ = auVar146._4_4_;
  uStack_9d0._0_4_ = auVar146._8_4_;
  uStack_9d0._4_4_ = auVar146._12_4_;
  local_1798 = auVar147._0_8_;
  uStack_1790 = auVar147._8_8_;
  local_9f8 = local_1798;
  uVar114 = local_9f8;
  uStack_9f0 = uStack_1790;
  uVar115 = uStack_9f0;
  local_9f8._0_4_ = auVar147._0_4_;
  local_9f8._4_4_ = auVar147._4_4_;
  uStack_9f0._0_4_ = auVar147._8_4_;
  uStack_9f0._4_4_ = auVar147._12_4_;
  local_17a8 = auVar148._0_8_;
  uStack_17a0 = auVar148._8_8_;
  local_a18 = local_17a8;
  uVar112 = local_a18;
  uStack_a10 = uStack_17a0;
  uVar113 = uStack_a10;
  local_a18._0_4_ = auVar148._0_4_;
  local_a18._4_4_ = auVar148._4_4_;
  uStack_a10._0_4_ = auVar148._8_4_;
  uStack_a10._4_4_ = auVar148._12_4_;
  local_5b8 = CONCAT44(local_9b8._4_4_ + 0x800,(int)local_9b8 + 0x800);
  uStack_5b0 = CONCAT44(uStack_9b0._4_4_ + 0x800,(int)uStack_9b0 + 0x800);
  local_5bc = 0xc;
  auVar145 = ZEXT416(0xc);
  local_5d8 = CONCAT44(local_9d8._4_4_ + 0x800,(int)local_9d8 + 0x800);
  uStack_5d0 = CONCAT44(uStack_9d0._4_4_ + 0x800,(int)uStack_9d0 + 0x800);
  local_5dc = 0xc;
  auVar146 = ZEXT416(0xc);
  local_5f8 = CONCAT44(local_9f8._4_4_ + 0x800,(int)local_9f8 + 0x800);
  uStack_5f0 = CONCAT44(uStack_9f0._4_4_ + 0x800,(int)uStack_9f0 + 0x800);
  local_5fc = 0xc;
  auVar147 = ZEXT416(0xc);
  local_618 = CONCAT44(local_a18._4_4_ + 0x800,(int)local_a18 + 0x800);
  uStack_610 = CONCAT44(uStack_a10._4_4_ + 0x800,(int)uStack_a10 + 0x800);
  local_61c = 0xc;
  auVar148 = ZEXT416(0xc);
  iVar144 = (int)local_a18 + 0x800 >> auVar148;
  iVar154 = local_a18._4_4_ + 0x800 >> auVar148;
  iVar155 = (int)uStack_a10 + 0x800 >> auVar148;
  iVar156 = uStack_a10._4_4_ + 0x800 >> auVar148;
  local_2f8 = CONCAT44(local_9b8._4_4_ + 0x800 >> auVar145,(int)local_9b8 + 0x800 >> auVar145);
  uStack_2f0 = CONCAT44(uStack_9b0._4_4_ + 0x800 >> auVar145,(int)uStack_9b0 + 0x800 >> auVar145);
  local_308 = CONCAT44(local_9d8._4_4_ + 0x800 >> auVar146,(int)local_9d8 + 0x800 >> auVar146);
  uStack_300 = CONCAT44(uStack_9d0._4_4_ + 0x800 >> auVar146,(int)uStack_9d0 + 0x800 >> auVar146);
  auVar75._8_8_ = uStack_2f0;
  auVar75._0_8_ = local_2f8;
  auVar74._8_8_ = uStack_300;
  auVar74._0_8_ = local_308;
  local_1448 = packssdw(auVar75,auVar74);
  local_318 = CONCAT44(local_9f8._4_4_ + 0x800 >> auVar147,(int)local_9f8 + 0x800 >> auVar147);
  uStack_310 = CONCAT44(uStack_9f0._4_4_ + 0x800 >> auVar147,(int)uStack_9f0 + 0x800 >> auVar147);
  local_328 = CONCAT44(iVar154,iVar144);
  uStack_320 = CONCAT44(iVar156,iVar155);
  auVar73._8_8_ = uStack_310;
  auVar73._0_8_ = local_318;
  auVar72._8_8_ = uStack_320;
  auVar72._0_8_ = local_328;
  local_1438 = packssdw(auVar73,auVar72);
  local_11b8._0_2_ = (undefined2)local_10b8;
  local_11b8._2_2_ = (undefined2)((ulong)local_10b8 >> 0x10);
  local_11b8._4_2_ = (undefined2)((ulong)local_10b8 >> 0x20);
  local_11b8._6_2_ = (undefined2)((ulong)local_10b8 >> 0x30);
  local_11c8._0_2_ = (undefined2)local_10c8;
  local_11c8._2_2_ = (undefined2)((ulong)local_10c8 >> 0x10);
  local_11c8._4_2_ = (undefined2)((ulong)local_10c8 >> 0x20);
  local_11c8._6_2_ = (undefined2)((ulong)local_10c8 >> 0x30);
  uStack_10b0._0_2_ = (undefined2)uStack_11b0;
  uStack_10b0._2_2_ = (undefined2)((ulong)uStack_11b0 >> 0x10);
  uStack_10b0._4_2_ = (undefined2)((ulong)uStack_11b0 >> 0x20);
  uStack_10b0._6_2_ = (undefined2)((ulong)uStack_11b0 >> 0x30);
  uStack_10c0._0_2_ = (undefined2)uStack_11c0;
  uStack_10c0._4_2_ = (undefined2)((ulong)uStack_11c0 >> 0x20);
  uStack_10c0._6_2_ = (undefined2)((ulong)uStack_11c0 >> 0x30);
  uStack_1842 = (undefined1)((ulong)uStack_11c0 >> 0x10);
  cos_bit_02 = (int8_t)((ulong)uStack_11c0 >> 0x18);
  local_e38 = CONCAT26(local_11c8._2_2_,
                       CONCAT24(local_11b8._2_2_,
                                CONCAT22((undefined2)local_11c8,(undefined2)local_11b8)));
  uStack_e30 = CONCAT26(local_11c8._6_2_,
                        CONCAT24(local_11b8._6_2_,CONCAT22(local_11c8._4_2_,local_11b8._4_2_)));
  auVar23._8_8_ = uStack_e30;
  auVar23._0_8_ = local_e38;
  auVar149._8_8_ = uStack_1330;
  auVar149._0_8_ = local_1338;
  auVar149 = pmaddwd(auVar23,auVar149);
  local_e58 = CONCAT17(cos_bit_02,
                       CONCAT16(uStack_1842,
                                CONCAT24(uStack_10b0._2_2_,
                                         CONCAT22((undefined2)uStack_10c0,(undefined2)uStack_10b0)))
                      );
  uStack_e50 = CONCAT26(uStack_10c0._6_2_,
                        CONCAT24(uStack_10b0._6_2_,CONCAT22(uStack_10c0._4_2_,uStack_10b0._4_2_)));
  auVar22._8_8_ = uStack_e50;
  auVar22._0_8_ = local_e58;
  auVar21._8_8_ = uStack_1330;
  auVar21._0_8_ = local_1338;
  auVar145 = pmaddwd(auVar22,auVar21);
  cospi_00 = auVar145._0_8_;
  x_01 = auVar145._8_8_;
  local_e78 = CONCAT26(local_11c8._2_2_,
                       CONCAT24(local_11b8._2_2_,
                                CONCAT22((undefined2)local_11c8,(undefined2)local_11b8)));
  uStack_e70 = CONCAT26(local_11c8._6_2_,
                        CONCAT24(local_11b8._6_2_,CONCAT22(local_11c8._4_2_,local_11b8._4_2_)));
  auVar20._8_8_ = uStack_e70;
  auVar20._0_8_ = local_e78;
  auVar150._8_8_ = uStack_1340;
  auVar150._0_8_ = local_1348;
  auVar150 = pmaddwd(auVar20,auVar150);
  uVar158 = auVar150._0_7_;
  cos_bit_01 = auVar150[7];
  lVar159 = auVar150._8_8_;
  local_e98 = CONCAT17(cos_bit_02,
                       CONCAT16(uStack_1842,
                                CONCAT24(uStack_10b0._2_2_,
                                         CONCAT22((undefined2)uStack_10c0,(undefined2)uStack_10b0)))
                      );
  uStack_e90 = CONCAT26(uStack_10c0._6_2_,
                        CONCAT24(uStack_10b0._6_2_,CONCAT22(uStack_10c0._4_2_,uStack_10b0._4_2_)));
  auVar19._8_8_ = uStack_e90;
  auVar19._0_8_ = local_e98;
  auVar151._8_8_ = uStack_1340;
  auVar151._0_8_ = local_1348;
  auVar151 = pmaddwd(auVar19,auVar151);
  cos_bit_00 = auVar151[7];
  uVar157 = auVar151._8_8_;
  uStack_1850 = auVar149._8_8_;
  uStack_a30 = uStack_1850;
  uVar111 = uStack_a30;
  local_a38._0_4_ = auVar149._0_4_;
  local_a38._4_4_ = auVar149._4_4_;
  uStack_a30._0_4_ = auVar149._8_4_;
  uStack_a30._4_4_ = auVar149._12_4_;
  local_a58._0_4_ = auVar145._0_4_;
  local_a58._4_4_ = auVar145._4_4_;
  uStack_a50._0_4_ = auVar145._8_4_;
  uStack_a50._4_4_ = auVar145._12_4_;
  local_a78._0_4_ = auVar150._0_4_;
  local_a78._4_4_ = auVar150._4_4_;
  uStack_a70._0_4_ = auVar150._8_4_;
  uStack_a70._4_4_ = auVar150._12_4_;
  local_a98._0_4_ = auVar151._0_4_;
  local_a98._4_4_ = auVar151._4_4_;
  uStack_a90._0_4_ = auVar151._8_4_;
  uStack_a90._4_4_ = auVar151._12_4_;
  local_638 = CONCAT44(local_a38._4_4_ + 0x800,(int)local_a38 + 0x800);
  uStack_630 = CONCAT44(uStack_a30._4_4_ + 0x800,(int)uStack_a30 + 0x800);
  local_63c = 0xc;
  auVar145 = ZEXT416(0xc);
  local_658 = CONCAT44(local_a58._4_4_ + 0x800,(int)local_a58 + 0x800);
  uStack_650 = CONCAT44(uStack_a50._4_4_ + 0x800,(int)uStack_a50 + 0x800);
  local_65c = 0xc;
  auVar146 = ZEXT416(0xc);
  local_678 = CONCAT44(local_a78._4_4_ + 0x800,(int)local_a78 + 0x800);
  uStack_670 = CONCAT44(uStack_a70._4_4_ + 0x800,(int)uStack_a70 + 0x800);
  local_67c = 0xc;
  auVar147 = ZEXT416(0xc);
  local_698 = CONCAT44(local_a98._4_4_ + 0x800,(int)local_a98 + 0x800);
  uStack_690 = CONCAT44(uStack_a90._4_4_ + 0x800,(int)uStack_a90 + 0x800);
  local_69c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_338 = CONCAT44(local_a38._4_4_ + 0x800 >> auVar145,(int)local_a38 + 0x800 >> auVar145);
  uStack_330 = CONCAT44(uStack_a30._4_4_ + 0x800 >> auVar145,(int)uStack_a30 + 0x800 >> auVar145);
  local_348 = CONCAT44(local_a58._4_4_ + 0x800 >> auVar146,(int)local_a58 + 0x800 >> auVar146);
  uStack_340 = CONCAT44(uStack_a50._4_4_ + 0x800 >> auVar146,(int)uStack_a50 + 0x800 >> auVar146);
  auVar71._8_8_ = uStack_330;
  auVar71._0_8_ = local_338;
  auVar70._8_8_ = uStack_340;
  auVar70._0_8_ = local_348;
  local_1428 = packssdw(auVar71,auVar70);
  local_358 = CONCAT44(local_a78._4_4_ + 0x800 >> auVar147,(int)local_a78 + 0x800 >> auVar147);
  uStack_350 = CONCAT44(uStack_a70._4_4_ + 0x800 >> auVar147,(int)uStack_a70 + 0x800 >> auVar147);
  local_368 = CONCAT44(local_a98._4_4_ + 0x800 >> auVar148,(int)local_a98 + 0x800 >> auVar148);
  uStack_360 = CONCAT44(uStack_a90._4_4_ + 0x800 >> auVar148,(int)uStack_a90 + 0x800 >> auVar148);
  auVar69._8_8_ = uStack_350;
  auVar69._0_8_ = local_358;
  auVar68._8_8_ = uStack_360;
  auVar68._0_8_ = local_368;
  local_1418 = packssdw(auVar69,auVar68);
  local_11d8._0_2_ = (undefined2)local_10d8;
  local_11d8._2_2_ = (undefined2)((ulong)local_10d8 >> 0x10);
  local_11d8._4_2_ = (undefined2)((ulong)local_10d8 >> 0x20);
  local_11d8._6_2_ = (undefined2)((ulong)local_10d8 >> 0x30);
  local_11e8._0_2_ = (undefined2)local_10e8;
  local_11e8._2_2_ = (undefined2)((ulong)local_10e8 >> 0x10);
  local_11e8._4_2_ = (undefined2)((ulong)local_10e8 >> 0x20);
  local_11e8._6_2_ = (undefined2)((ulong)local_10e8 >> 0x30);
  uStack_10d0._0_2_ = (undefined2)uStack_11d0;
  uStack_10d0._2_2_ = (undefined2)((ulong)uStack_11d0 >> 0x10);
  uStack_10d0._4_2_ = (undefined2)((ulong)uStack_11d0 >> 0x20);
  uStack_10d0._6_2_ = (undefined2)((ulong)uStack_11d0 >> 0x30);
  uStack_10e0._0_2_ = (undefined2)uStack_11e0;
  uStack_10e0._2_2_ = (undefined2)((ulong)uStack_11e0 >> 0x10);
  uStack_10e0._4_2_ = (undefined2)((ulong)uStack_11e0 >> 0x20);
  uStack_10e0._6_2_ = (undefined2)((ulong)uStack_11e0 >> 0x30);
  local_eb8 = CONCAT26(local_11e8._2_2_,
                       CONCAT24(local_11d8._2_2_,
                                CONCAT22((undefined2)local_11e8,(undefined2)local_11d8)));
  uStack_eb0 = CONCAT26(local_11e8._6_2_,
                        CONCAT24(local_11d8._6_2_,CONCAT22(local_11e8._4_2_,local_11d8._4_2_)));
  auVar18._8_8_ = uStack_eb0;
  auVar18._0_8_ = local_eb8;
  auVar17._8_8_ = uStack_1350;
  auVar17._0_8_ = local_1358;
  auVar145 = pmaddwd(auVar18,auVar17);
  local_ed8 = CONCAT26(uStack_10e0._2_2_,
                       CONCAT24(uStack_10d0._2_2_,
                                CONCAT22((undefined2)uStack_10e0,(undefined2)uStack_10d0)));
  uStack_ed0 = CONCAT26(uStack_10e0._6_2_,
                        CONCAT24(uStack_10d0._6_2_,CONCAT22(uStack_10e0._4_2_,uStack_10d0._4_2_)));
  auVar16._8_8_ = uStack_ed0;
  auVar16._0_8_ = local_ed8;
  auVar15._8_8_ = uStack_1350;
  auVar15._0_8_ = local_1358;
  auVar146 = pmaddwd(auVar16,auVar15);
  local_ef8 = CONCAT26(local_11e8._2_2_,
                       CONCAT24(local_11d8._2_2_,
                                CONCAT22((undefined2)local_11e8,(undefined2)local_11d8)));
  uStack_ef0 = CONCAT26(local_11e8._6_2_,
                        CONCAT24(local_11d8._6_2_,CONCAT22(local_11e8._4_2_,local_11d8._4_2_)));
  auVar14._8_8_ = uStack_ef0;
  auVar14._0_8_ = local_ef8;
  auVar13._8_8_ = uStack_1360;
  auVar13._0_8_ = local_1368;
  auVar147 = pmaddwd(auVar14,auVar13);
  local_f18 = CONCAT26(uStack_10e0._2_2_,
                       CONCAT24(uStack_10d0._2_2_,
                                CONCAT22((undefined2)uStack_10e0,(undefined2)uStack_10d0)));
  uStack_f10 = CONCAT26(uStack_10e0._6_2_,
                        CONCAT24(uStack_10d0._6_2_,CONCAT22(uStack_10e0._4_2_,uStack_10d0._4_2_)));
  auVar12._8_8_ = uStack_f10;
  auVar12._0_8_ = local_f18;
  auVar11._8_8_ = uStack_1360;
  auVar11._0_8_ = local_1368;
  auVar148 = pmaddwd(auVar12,auVar11);
  local_1938 = auVar145._0_8_;
  uStack_1930 = auVar145._8_8_;
  local_ab8 = local_1938;
  uVar109 = local_ab8;
  uStack_ab0 = uStack_1930;
  uVar110 = uStack_ab0;
  local_ab8._0_4_ = auVar145._0_4_;
  local_ab8._4_4_ = auVar145._4_4_;
  uStack_ab0._0_4_ = auVar145._8_4_;
  uStack_ab0._4_4_ = auVar145._12_4_;
  local_1948 = auVar146._0_8_;
  uStack_1940 = auVar146._8_8_;
  local_ad8 = local_1948;
  uVar107 = local_ad8;
  uStack_ad0 = uStack_1940;
  uVar108 = uStack_ad0;
  local_ad8._0_4_ = auVar146._0_4_;
  local_ad8._4_4_ = auVar146._4_4_;
  uStack_ad0._0_4_ = auVar146._8_4_;
  uStack_ad0._4_4_ = auVar146._12_4_;
  local_1958 = auVar147._0_8_;
  uStack_1950 = auVar147._8_8_;
  local_af8 = local_1958;
  uVar105 = local_af8;
  uStack_af0 = uStack_1950;
  uVar106 = uStack_af0;
  local_af8._0_4_ = auVar147._0_4_;
  local_af8._4_4_ = auVar147._4_4_;
  uStack_af0._0_4_ = auVar147._8_4_;
  uStack_af0._4_4_ = auVar147._12_4_;
  local_1968 = auVar148._0_8_;
  uStack_1960 = auVar148._8_8_;
  local_b18 = local_1968;
  uVar103 = local_b18;
  uStack_b10 = uStack_1960;
  uVar104 = uStack_b10;
  local_b18._0_4_ = auVar148._0_4_;
  local_b18._4_4_ = auVar148._4_4_;
  uStack_b10._0_4_ = auVar148._8_4_;
  uStack_b10._4_4_ = auVar148._12_4_;
  local_6b8 = CONCAT44(local_ab8._4_4_ + 0x800,(int)local_ab8 + 0x800);
  uStack_6b0 = CONCAT44(uStack_ab0._4_4_ + 0x800,(int)uStack_ab0 + 0x800);
  local_6bc = 0xc;
  auVar145 = ZEXT416(0xc);
  local_6d8 = CONCAT44(local_ad8._4_4_ + 0x800,(int)local_ad8 + 0x800);
  uStack_6d0 = CONCAT44(uStack_ad0._4_4_ + 0x800,(int)uStack_ad0 + 0x800);
  local_6dc = 0xc;
  auVar146 = ZEXT416(0xc);
  local_6f8 = CONCAT44(local_af8._4_4_ + 0x800,(int)local_af8 + 0x800);
  uStack_6f0 = CONCAT44(uStack_af0._4_4_ + 0x800,(int)uStack_af0 + 0x800);
  local_6fc = 0xc;
  auVar147 = ZEXT416(0xc);
  local_718 = CONCAT44(local_b18._4_4_ + 0x800,(int)local_b18 + 0x800);
  uStack_710 = CONCAT44(uStack_b10._4_4_ + 0x800,(int)uStack_b10 + 0x800);
  local_71c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_378 = CONCAT44(local_ab8._4_4_ + 0x800 >> auVar145,(int)local_ab8 + 0x800 >> auVar145);
  uStack_370 = CONCAT44(uStack_ab0._4_4_ + 0x800 >> auVar145,(int)uStack_ab0 + 0x800 >> auVar145);
  local_388 = CONCAT44(local_ad8._4_4_ + 0x800 >> auVar146,(int)local_ad8 + 0x800 >> auVar146);
  uStack_380 = CONCAT44(uStack_ad0._4_4_ + 0x800 >> auVar146,(int)uStack_ad0 + 0x800 >> auVar146);
  auVar67._8_8_ = uStack_370;
  auVar67._0_8_ = local_378;
  auVar66._8_8_ = uStack_380;
  auVar66._0_8_ = local_388;
  local_1408 = packssdw(auVar67,auVar66);
  local_398 = CONCAT44(local_af8._4_4_ + 0x800 >> auVar147,(int)local_af8 + 0x800 >> auVar147);
  uStack_390 = CONCAT44(uStack_af0._4_4_ + 0x800 >> auVar147,(int)uStack_af0 + 0x800 >> auVar147);
  local_3a8 = CONCAT44(local_b18._4_4_ + 0x800 >> auVar148,(int)local_b18 + 0x800 >> auVar148);
  uStack_3a0 = CONCAT44(uStack_b10._4_4_ + 0x800 >> auVar148,(int)uStack_b10 + 0x800 >> auVar148);
  auVar65._8_8_ = uStack_390;
  auVar65._0_8_ = local_398;
  auVar64._8_8_ = uStack_3a0;
  auVar64._0_8_ = local_3a8;
  local_13f8 = packssdw(auVar65,auVar64);
  local_11f8._0_2_ = (undefined2)local_10f8;
  local_11f8._2_2_ = (undefined2)((ulong)local_10f8 >> 0x10);
  local_11f8._4_2_ = (undefined2)((ulong)local_10f8 >> 0x20);
  local_11f8._6_2_ = (undefined2)((ulong)local_10f8 >> 0x30);
  local_1208._0_2_ = (undefined2)local_1108;
  local_1208._2_2_ = (undefined2)((ulong)local_1108 >> 0x10);
  local_1208._4_2_ = (undefined2)((ulong)local_1108 >> 0x20);
  local_1208._6_2_ = (undefined2)((ulong)local_1108 >> 0x30);
  uStack_10f0._0_2_ = (undefined2)uStack_11f0;
  uStack_10f0._2_2_ = (undefined2)((ulong)uStack_11f0 >> 0x10);
  uStack_10f0._4_2_ = (undefined2)((ulong)uStack_11f0 >> 0x20);
  uStack_10f0._6_2_ = (undefined2)((ulong)uStack_11f0 >> 0x30);
  uStack_1100._0_2_ = (undefined2)uStack_1200;
  uStack_1100._2_2_ = (undefined2)((ulong)uStack_1200 >> 0x10);
  uStack_1100._4_2_ = (undefined2)((ulong)uStack_1200 >> 0x20);
  uStack_1100._6_2_ = (undefined2)((ulong)uStack_1200 >> 0x30);
  local_f38 = CONCAT26(local_1208._2_2_,
                       CONCAT24(local_11f8._2_2_,
                                CONCAT22((undefined2)local_1208,(undefined2)local_11f8)));
  uStack_f30 = CONCAT26(local_1208._6_2_,
                        CONCAT24(local_11f8._6_2_,CONCAT22(local_1208._4_2_,local_11f8._4_2_)));
  auVar10._8_8_ = uStack_f30;
  auVar10._0_8_ = local_f38;
  auVar9._8_8_ = uStack_1370;
  auVar9._0_8_ = local_1378;
  auVar145 = pmaddwd(auVar10,auVar9);
  local_f58 = CONCAT26(uStack_1100._2_2_,
                       CONCAT24(uStack_10f0._2_2_,
                                CONCAT22((undefined2)uStack_1100,(undefined2)uStack_10f0)));
  uStack_f50 = CONCAT26(uStack_1100._6_2_,
                        CONCAT24(uStack_10f0._6_2_,CONCAT22(uStack_1100._4_2_,uStack_10f0._4_2_)));
  auVar8._8_8_ = uStack_f50;
  auVar8._0_8_ = local_f58;
  auVar7._8_8_ = uStack_1370;
  auVar7._0_8_ = local_1378;
  auVar146 = pmaddwd(auVar8,auVar7);
  local_f78 = CONCAT26(local_1208._2_2_,
                       CONCAT24(local_11f8._2_2_,
                                CONCAT22((undefined2)local_1208,(undefined2)local_11f8)));
  uStack_f70 = CONCAT26(local_1208._6_2_,
                        CONCAT24(local_11f8._6_2_,CONCAT22(local_1208._4_2_,local_11f8._4_2_)));
  auVar6._8_8_ = uStack_f70;
  auVar6._0_8_ = local_f78;
  auVar5._8_8_ = uStack_1380;
  auVar5._0_8_ = local_1388;
  auVar147 = pmaddwd(auVar6,auVar5);
  local_f98 = CONCAT26(uStack_1100._2_2_,
                       CONCAT24(uStack_10f0._2_2_,
                                CONCAT22((undefined2)uStack_1100,(undefined2)uStack_10f0)));
  uStack_f90 = CONCAT26(uStack_1100._6_2_,
                        CONCAT24(uStack_10f0._6_2_,CONCAT22(uStack_1100._4_2_,uStack_10f0._4_2_)));
  auVar4._8_8_ = uStack_f90;
  auVar4._0_8_ = local_f98;
  auVar3._8_8_ = uStack_1380;
  auVar3._0_8_ = local_1388;
  auVar148 = pmaddwd(auVar4,auVar3);
  local_1a18 = auVar145._0_8_;
  uStack_1a10 = auVar145._8_8_;
  local_b38 = local_1a18;
  uVar101 = local_b38;
  uStack_b30 = uStack_1a10;
  uVar102 = uStack_b30;
  local_b38._0_4_ = auVar145._0_4_;
  local_b38._4_4_ = auVar145._4_4_;
  uStack_b30._0_4_ = auVar145._8_4_;
  uStack_b30._4_4_ = auVar145._12_4_;
  local_1a28 = auVar146._0_8_;
  uStack_1a20 = auVar146._8_8_;
  local_b58 = local_1a28;
  uVar99 = local_b58;
  uStack_b50 = uStack_1a20;
  uVar100 = uStack_b50;
  local_b58._0_4_ = auVar146._0_4_;
  local_b58._4_4_ = auVar146._4_4_;
  uStack_b50._0_4_ = auVar146._8_4_;
  uStack_b50._4_4_ = auVar146._12_4_;
  local_1a38 = auVar147._0_8_;
  uStack_1a30 = auVar147._8_8_;
  local_b78 = local_1a38;
  uVar97 = local_b78;
  uStack_b70 = uStack_1a30;
  uVar98 = uStack_b70;
  local_b78._0_4_ = auVar147._0_4_;
  local_b78._4_4_ = auVar147._4_4_;
  uStack_b70._0_4_ = auVar147._8_4_;
  uStack_b70._4_4_ = auVar147._12_4_;
  local_1a48 = auVar148._0_8_;
  uStack_1a40 = auVar148._8_8_;
  local_b98 = local_1a48;
  uVar95 = local_b98;
  uStack_b90 = uStack_1a40;
  uVar96 = uStack_b90;
  local_b98._0_4_ = auVar148._0_4_;
  local_b98._4_4_ = auVar148._4_4_;
  uStack_b90._0_4_ = auVar148._8_4_;
  uStack_b90._4_4_ = auVar148._12_4_;
  local_738 = CONCAT44(local_b38._4_4_ + 0x800,(int)local_b38 + 0x800);
  uStack_730 = CONCAT44(uStack_b30._4_4_ + 0x800,(int)uStack_b30 + 0x800);
  local_73c = 0xc;
  auVar145 = ZEXT416(0xc);
  local_758 = CONCAT44(local_b58._4_4_ + 0x800,(int)local_b58 + 0x800);
  uStack_750 = CONCAT44(uStack_b50._4_4_ + 0x800,(int)uStack_b50 + 0x800);
  local_75c = 0xc;
  auVar146 = ZEXT416(0xc);
  local_778 = CONCAT44(local_b78._4_4_ + 0x800,(int)local_b78 + 0x800);
  uStack_770 = CONCAT44(uStack_b70._4_4_ + 0x800,(int)uStack_b70 + 0x800);
  local_77c = 0xc;
  auVar147 = ZEXT416(0xc);
  local_798 = CONCAT44(local_b98._4_4_ + 0x800,(int)local_b98 + 0x800);
  uStack_790 = CONCAT44(uStack_b90._4_4_ + 0x800,(int)uStack_b90 + 0x800);
  local_79c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_3b8 = CONCAT44(local_b38._4_4_ + 0x800 >> auVar145,(int)local_b38 + 0x800 >> auVar145);
  uStack_3b0 = CONCAT44(uStack_b30._4_4_ + 0x800 >> auVar145,(int)uStack_b30 + 0x800 >> auVar145);
  local_3c8 = CONCAT44(local_b58._4_4_ + 0x800 >> auVar146,(int)local_b58 + 0x800 >> auVar146);
  uStack_3c0 = CONCAT44(uStack_b50._4_4_ + 0x800 >> auVar146,(int)uStack_b50 + 0x800 >> auVar146);
  auVar63._8_8_ = uStack_3b0;
  auVar63._0_8_ = local_3b8;
  auVar62._8_8_ = uStack_3c0;
  auVar62._0_8_ = local_3c8;
  local_13e8 = packssdw(auVar63,auVar62);
  local_3d8 = CONCAT44(local_b78._4_4_ + 0x800 >> auVar147,(int)local_b78 + 0x800 >> auVar147);
  uStack_3d0 = CONCAT44(uStack_b70._4_4_ + 0x800 >> auVar147,(int)uStack_b70 + 0x800 >> auVar147);
  local_3e8 = CONCAT44(local_b98._4_4_ + 0x800 >> auVar148,(int)local_b98 + 0x800 >> auVar148);
  uStack_3e0 = CONCAT44(uStack_b90._4_4_ + 0x800 >> auVar148,(int)uStack_b90 + 0x800 >> auVar148);
  auVar61._8_8_ = uStack_3d0;
  auVar61._0_8_ = local_3d8;
  auVar60._8_8_ = uStack_3e0;
  auVar60._0_8_ = local_3e8;
  local_13d8 = packssdw(auVar61,auVar60);
  local_1218._0_2_ = (undefined2)local_1118;
  local_1218._2_2_ = (undefined2)((ulong)local_1118 >> 0x10);
  local_1218._4_2_ = (undefined2)((ulong)local_1118 >> 0x20);
  local_1218._6_2_ = (undefined2)((ulong)local_1118 >> 0x30);
  local_1228._0_2_ = (undefined2)local_1128;
  local_1228._2_2_ = (undefined2)((ulong)local_1128 >> 0x10);
  local_1228._4_2_ = (undefined2)((ulong)local_1128 >> 0x20);
  local_1228._6_2_ = (undefined2)((ulong)local_1128 >> 0x30);
  uStack_1110._0_2_ = (undefined2)uStack_1210;
  uStack_1110._2_2_ = (undefined2)((ulong)uStack_1210 >> 0x10);
  uStack_1110._4_2_ = (undefined2)((ulong)uStack_1210 >> 0x20);
  uStack_1110._6_2_ = (undefined2)((ulong)uStack_1210 >> 0x30);
  uStack_1120._0_2_ = (undefined2)uStack_1220;
  uStack_1120._2_2_ = (undefined2)((ulong)uStack_1220 >> 0x10);
  uStack_1120._4_2_ = (undefined2)((ulong)uStack_1220 >> 0x20);
  uStack_1120._6_2_ = (undefined2)((ulong)uStack_1220 >> 0x30);
  local_fb8 = CONCAT26(local_1228._2_2_,
                       CONCAT24(local_1218._2_2_,
                                CONCAT22((undefined2)local_1228,(undefined2)local_1218)));
  uStack_fb0 = CONCAT26(local_1228._6_2_,
                        CONCAT24(local_1218._6_2_,CONCAT22(local_1228._4_2_,local_1218._4_2_)));
  auVar2._8_8_ = uStack_fb0;
  auVar2._0_8_ = local_fb8;
  auVar152._8_8_ = uStack_1390;
  auVar152._0_8_ = local_1398;
  auVar152 = pmaddwd(auVar2,auVar152);
  local_fd8 = CONCAT26(uStack_1120._2_2_,
                       CONCAT24(uStack_1110._2_2_,
                                CONCAT22((undefined2)uStack_1120,(undefined2)uStack_1110)));
  uStack_fd0 = CONCAT26(uStack_1120._6_2_,
                        CONCAT24(uStack_1110._6_2_,CONCAT22(uStack_1120._4_2_,uStack_1110._4_2_)));
  auVar1._8_8_ = uStack_fd0;
  auVar1._0_8_ = local_fd8;
  auVar153._8_8_ = uStack_1390;
  auVar153._0_8_ = local_1398;
  auVar153 = pmaddwd(auVar1,auVar153);
  local_ff8 = CONCAT26(local_1228._2_2_,
                       CONCAT24(local_1218._2_2_,
                                CONCAT22((undefined2)local_1228,(undefined2)local_1218)));
  uStack_ff0 = CONCAT26(local_1228._6_2_,
                        CONCAT24(local_1218._6_2_,CONCAT22(local_1228._4_2_,local_1218._4_2_)));
  auVar148._8_8_ = uStack_ff0;
  auVar148._0_8_ = local_ff8;
  auVar147._8_8_ = uStack_13a0;
  auVar147._0_8_ = local_13a8;
  auVar147 = pmaddwd(auVar148,auVar147);
  local_1018 = CONCAT26(uStack_1120._2_2_,
                        CONCAT24(uStack_1110._2_2_,
                                 CONCAT22((undefined2)uStack_1120,(undefined2)uStack_1110)));
  uStack_1010 = CONCAT26(uStack_1120._6_2_,
                         CONCAT24(uStack_1110._6_2_,CONCAT22(uStack_1120._4_2_,uStack_1110._4_2_)));
  auVar146._8_8_ = uStack_1010;
  auVar146._0_8_ = local_1018;
  auVar145._8_8_ = uStack_13a0;
  auVar145._0_8_ = local_13a8;
  auVar145 = pmaddwd(auVar146,auVar145);
  local_1af8 = auVar152._0_8_;
  uStack_1af0 = auVar152._8_8_;
  local_bb8 = local_1af8;
  uVar93 = local_bb8;
  uStack_bb0 = uStack_1af0;
  uVar94 = uStack_bb0;
  local_bb8._0_4_ = auVar152._0_4_;
  local_bb8._4_4_ = auVar152._4_4_;
  uStack_bb0._0_4_ = auVar152._8_4_;
  uStack_bb0._4_4_ = auVar152._12_4_;
  local_1b08 = auVar153._0_8_;
  uStack_1b00 = auVar153._8_8_;
  local_bd8 = local_1b08;
  uVar91 = local_bd8;
  uStack_bd0 = uStack_1b00;
  uVar92 = uStack_bd0;
  local_bd8._0_4_ = auVar153._0_4_;
  local_bd8._4_4_ = auVar153._4_4_;
  uStack_bd0._0_4_ = auVar153._8_4_;
  uStack_bd0._4_4_ = auVar153._12_4_;
  local_1b18 = auVar147._0_8_;
  uStack_1b10 = auVar147._8_8_;
  local_bf8 = local_1b18;
  uVar89 = local_bf8;
  uStack_bf0 = uStack_1b10;
  uVar90 = uStack_bf0;
  local_bf8._0_4_ = auVar147._0_4_;
  local_bf8._4_4_ = auVar147._4_4_;
  uStack_bf0._0_4_ = auVar147._8_4_;
  uStack_bf0._4_4_ = auVar147._12_4_;
  x_00 = auVar145._0_8_;
  uStack_1b20 = auVar145._8_8_;
  uStack_c10 = uStack_1b20;
  uVar88 = uStack_c10;
  local_c18._0_4_ = auVar145._0_4_;
  local_c18._4_4_ = auVar145._4_4_;
  uStack_c10._0_4_ = auVar145._8_4_;
  uStack_c10._4_4_ = auVar145._12_4_;
  local_7b8 = CONCAT44(local_bb8._4_4_ + 0x800,(int)local_bb8 + 0x800);
  uStack_7b0 = CONCAT44(uStack_bb0._4_4_ + 0x800,(int)uStack_bb0 + 0x800);
  local_7bc = 0xc;
  auVar145 = ZEXT416(0xc);
  local_7d8 = CONCAT44(local_bd8._4_4_ + 0x800,(int)local_bd8 + 0x800);
  uStack_7d0 = CONCAT44(uStack_bd0._4_4_ + 0x800,(int)uStack_bd0 + 0x800);
  local_7dc = 0xc;
  auVar146 = ZEXT416(0xc);
  local_7f8 = CONCAT44(local_bf8._4_4_ + 0x800,(int)local_bf8 + 0x800);
  uStack_7f0 = CONCAT44(uStack_bf0._4_4_ + 0x800,(int)uStack_bf0 + 0x800);
  local_7fc = 0xc;
  auVar147 = ZEXT416(0xc);
  local_818 = CONCAT44(local_c18._4_4_ + 0x800,(int)local_c18 + 0x800);
  uStack_810 = CONCAT44(uStack_c10._4_4_ + 0x800,(int)uStack_c10 + 0x800);
  local_81c = 0xc;
  auVar148 = ZEXT416(0xc);
  local_3f8 = CONCAT44(local_bb8._4_4_ + 0x800 >> auVar145,(int)local_bb8 + 0x800 >> auVar145);
  uStack_3f0 = CONCAT44(uStack_bb0._4_4_ + 0x800 >> auVar145,(int)uStack_bb0 + 0x800 >> auVar145);
  local_408 = CONCAT44(local_bd8._4_4_ + 0x800 >> auVar146,(int)local_bd8 + 0x800 >> auVar146);
  uStack_400 = CONCAT44(uStack_bd0._4_4_ + 0x800 >> auVar146,(int)uStack_bd0 + 0x800 >> auVar146);
  auVar59._8_8_ = uStack_3f0;
  auVar59._0_8_ = local_3f8;
  auVar58._8_8_ = uStack_400;
  auVar58._0_8_ = local_408;
  local_13c8 = packssdw(auVar59,auVar58);
  local_418 = CONCAT44(local_bf8._4_4_ + 0x800 >> auVar147,(int)local_bf8 + 0x800 >> auVar147);
  uStack_410 = CONCAT44(uStack_bf0._4_4_ + 0x800 >> auVar147,(int)uStack_bf0 + 0x800 >> auVar147);
  local_428 = CONCAT44(local_c18._4_4_ + 0x800 >> auVar148,(int)local_c18 + 0x800 >> auVar148);
  uStack_420 = CONCAT44(uStack_c10._4_4_ + 0x800 >> auVar148,(int)uStack_c10 + 0x800 >> auVar148);
  auVar57._8_8_ = uStack_410;
  auVar57._0_8_ = local_418;
  auVar56._8_8_ = uStack_420;
  auVar56._0_8_ = local_428;
  local_13b8 = packssdw(auVar57,auVar56);
  uVar160 = uStack_10b0._4_2_;
  uVar161 = uStack_10c0._4_2_;
  uVar162 = uStack_10b0._6_2_;
  uVar163 = uStack_10c0._6_2_;
  uVar164 = (undefined2)local_11b8;
  uVar165 = (undefined2)local_11c8;
  uVar166 = local_11b8._2_2_;
  uVar167 = local_11c8._2_2_;
  local_1228 = local_1128;
  local_1218 = local_1118;
  local_1208 = local_1108;
  local_11f8 = local_10f8;
  local_11e8 = local_10e8;
  local_11d8 = local_10d8;
  local_11c8 = local_10c8;
  local_11b8 = local_10b8;
  local_11a8 = local_10a8;
  local_1198 = local_1098;
  local_1188 = local_1088;
  local_1178 = local_1078;
  local_1168 = local_1068;
  local_1158 = local_1058;
  local_1148 = local_1048;
  local_1138 = local_1038;
  uStack_1120 = uStack_1220;
  uStack_1110 = uStack_1210;
  uStack_1100 = uStack_1200;
  uStack_10f0 = uStack_11f0;
  uStack_10e0 = uStack_11e0;
  uStack_10d0 = uStack_11d0;
  uStack_10c0 = uStack_11c0;
  uStack_10b0 = uStack_11b0;
  uStack_10a0 = uStack_11a0;
  uStack_1090 = uStack_1190;
  uStack_1080 = uStack_1180;
  uStack_1070 = uStack_1170;
  uStack_1060 = uStack_1160;
  uStack_1050 = uStack_1150;
  uStack_1040 = uStack_1140;
  uStack_1030 = uStack_1130;
  local_1028 = local_13a8;
  uStack_1020 = uStack_13a0;
  local_1008 = local_13a8;
  uStack_1000 = uStack_13a0;
  local_fe8 = local_1398;
  uStack_fe0 = uStack_1390;
  local_fc8 = local_1398;
  uStack_fc0 = uStack_1390;
  local_fa8 = local_1388;
  uStack_fa0 = uStack_1380;
  local_f88 = local_1388;
  uStack_f80 = uStack_1380;
  local_f68 = local_1378;
  uStack_f60 = uStack_1370;
  local_f48 = local_1378;
  uStack_f40 = uStack_1370;
  local_f28 = local_1368;
  uStack_f20 = uStack_1360;
  local_f08 = local_1368;
  uStack_f00 = uStack_1360;
  local_ee8 = local_1358;
  uStack_ee0 = uStack_1350;
  local_ec8 = local_1358;
  uStack_ec0 = uStack_1350;
  local_ea8 = local_1348;
  uStack_ea0 = uStack_1340;
  local_e88 = local_1348;
  uStack_e80 = uStack_1340;
  local_e68 = local_1338;
  uStack_e60 = uStack_1330;
  local_e48 = local_1338;
  uStack_e40 = uStack_1330;
  local_e28 = local_1328;
  uStack_e20 = uStack_1320;
  local_e08 = local_1328;
  uStack_e00 = uStack_1320;
  local_de8 = local_1318;
  uStack_de0 = uStack_1310;
  local_dc8 = local_1318;
  uStack_dc0 = uStack_1310;
  local_da8 = local_1308;
  uStack_da0 = uStack_1300;
  local_d88 = local_1308;
  uStack_d80 = uStack_1300;
  local_d68 = local_12f8;
  uStack_d60 = uStack_12f0;
  local_d48 = local_12f8;
  uStack_d40 = uStack_12f0;
  local_d28 = local_12e8;
  uStack_d20 = uStack_12e0;
  local_d08 = local_12e8;
  uStack_d00 = uStack_12e0;
  local_ce8 = local_12d8;
  uStack_ce0 = uStack_12d0;
  local_cc8 = local_12d8;
  uStack_cc0 = uStack_12d0;
  local_ca8 = local_12c8;
  uStack_ca0 = uStack_12c0;
  local_c88 = local_12c8;
  uStack_c80 = uStack_12c0;
  local_c68 = local_12b8;
  uStack_c60 = uStack_12b0;
  local_c48 = local_12b8;
  uStack_c40 = uStack_12b0;
  local_c28 = local_12a8;
  uStack_c20 = uStack_12a0;
  local_c18 = x_00;
  uStack_c10 = uVar88;
  local_c08 = local_12a8;
  uStack_c00 = uStack_12a0;
  local_bf8 = uVar89;
  uStack_bf0 = uVar90;
  local_be8 = local_12a8;
  uStack_be0 = uStack_12a0;
  local_bd8 = uVar91;
  uStack_bd0 = uVar92;
  local_bc8 = local_12a8;
  uStack_bc0 = uStack_12a0;
  local_bb8 = uVar93;
  uStack_bb0 = uVar94;
  local_ba8 = local_12a8;
  uStack_ba0 = uStack_12a0;
  local_b98 = uVar95;
  uStack_b90 = uVar96;
  local_b88 = local_12a8;
  uStack_b80 = uStack_12a0;
  local_b78 = uVar97;
  uStack_b70 = uVar98;
  local_b68 = local_12a8;
  uStack_b60 = uStack_12a0;
  local_b58 = uVar99;
  uStack_b50 = uVar100;
  local_b48 = local_12a8;
  uStack_b40 = uStack_12a0;
  local_b38 = uVar101;
  uStack_b30 = uVar102;
  local_b28 = local_12a8;
  uStack_b20 = uStack_12a0;
  local_b18 = uVar103;
  uStack_b10 = uVar104;
  local_b08 = local_12a8;
  uStack_b00 = uStack_12a0;
  local_af8 = uVar105;
  uStack_af0 = uVar106;
  local_ae8 = local_12a8;
  uStack_ae0 = uStack_12a0;
  local_ad8 = uVar107;
  uStack_ad0 = uVar108;
  local_ac8 = local_12a8;
  uStack_ac0 = uStack_12a0;
  local_ab8 = uVar109;
  uStack_ab0 = uVar110;
  local_aa8 = local_12a8;
  uStack_aa0 = uStack_12a0;
  local_a98 = auVar151._0_8_;
  uStack_a90 = uVar157;
  local_a88 = local_12a8;
  uStack_a80 = uStack_12a0;
  local_a78 = auVar150._0_8_;
  uStack_a70 = lVar159;
  local_a68 = local_12a8;
  uStack_a60 = uStack_12a0;
  local_a58 = cospi_00;
  uStack_a50 = x_01;
  local_a48 = local_12a8;
  uStack_a40 = uStack_12a0;
  local_a38 = auVar149._0_8_;
  uStack_a30 = uVar111;
  local_a28 = local_12a8;
  uStack_a20 = uStack_12a0;
  local_a18 = uVar112;
  uStack_a10 = uVar113;
  local_a08 = local_12a8;
  uStack_a00 = uStack_12a0;
  local_9f8 = uVar114;
  uStack_9f0 = uVar115;
  local_9e8 = local_12a8;
  uStack_9e0 = uStack_12a0;
  local_9d8 = uVar116;
  uStack_9d0 = uVar117;
  local_9c8 = local_12a8;
  uStack_9c0 = uStack_12a0;
  local_9b8 = uVar118;
  uStack_9b0 = uVar119;
  local_9a8 = local_12a8;
  uStack_9a0 = uStack_12a0;
  local_998 = uVar120;
  uStack_990 = uVar121;
  local_988 = local_12a8;
  uStack_980 = uStack_12a0;
  local_978 = uVar122;
  uStack_970 = uVar123;
  local_968 = local_12a8;
  uStack_960 = uStack_12a0;
  local_958 = uVar124;
  uStack_950 = uVar125;
  local_948 = local_12a8;
  uStack_940 = uStack_12a0;
  local_938 = uVar126;
  uStack_930 = uVar127;
  local_928 = local_12a8;
  uStack_920 = uStack_12a0;
  local_918 = uVar128;
  uStack_910 = uVar129;
  local_908 = local_12a8;
  uStack_900 = uStack_12a0;
  local_8f8 = uVar130;
  uStack_8f0 = uVar131;
  local_8e8 = local_12a8;
  uStack_8e0 = uStack_12a0;
  local_8d8 = uVar132;
  uStack_8d0 = uVar133;
  local_8c8 = local_12a8;
  uStack_8c0 = uStack_12a0;
  local_8b8 = uVar134;
  uStack_8b0 = uVar135;
  local_8a8 = local_12a8;
  uStack_8a0 = uStack_12a0;
  local_898 = uVar136;
  uStack_890 = uVar137;
  local_888 = local_12a8;
  uStack_880 = uStack_12a0;
  local_878 = uVar138;
  uStack_870 = uVar139;
  local_868 = local_12a8;
  uStack_860 = uStack_12a0;
  local_858 = uVar140;
  uStack_850 = uVar141;
  local_848 = local_12a8;
  uStack_840 = uStack_12a0;
  local_838 = uVar142;
  uStack_830 = uVar143;
  local_228 = local_12a8;
  uStack_220 = uStack_12a0;
  local_208 = local_12b8;
  uStack_200 = uStack_12b0;
  local_1f8 = local_1230;
  local_1f4 = local_1230;
  local_1f0 = local_1230;
  local_1ec = local_1230;
  local_1e8 = local_12c8;
  uStack_1e0 = uStack_12c0;
  local_1d8 = local_1234;
  local_1d4 = local_1234;
  local_1d0 = local_1234;
  local_1cc = local_1234;
  local_1c8 = local_12d8;
  uStack_1c0 = uStack_12d0;
  local_1b8 = local_1238;
  local_1b4 = local_1238;
  local_1b0 = local_1238;
  local_1ac = local_1238;
  local_1a8 = local_12e8;
  uStack_1a0 = uStack_12e0;
  local_198 = local_123c;
  local_194 = local_123c;
  local_190 = local_123c;
  local_18c = local_123c;
  local_188 = local_12f8;
  uStack_180 = uStack_12f0;
  local_178 = local_1240;
  local_174 = local_1240;
  local_170 = local_1240;
  local_16c = local_1240;
  local_168 = local_1308;
  uStack_160 = uStack_1300;
  local_158 = local_1244;
  local_154 = local_1244;
  local_150 = local_1244;
  local_14c = local_1244;
  local_148 = local_1318;
  uStack_140 = uStack_1310;
  local_138 = local_1248;
  local_134 = local_1248;
  local_130 = local_1248;
  local_12c = local_1248;
  local_128 = local_1328;
  uStack_120 = uStack_1320;
  local_118 = local_124c;
  local_114 = local_124c;
  local_110 = local_124c;
  local_10c = local_124c;
  local_108 = local_1338;
  uStack_100 = uStack_1330;
  local_f8 = local_1250;
  local_f4 = local_1250;
  local_f0 = local_1250;
  local_ec = local_1250;
  local_e8 = local_1348;
  uStack_e0 = uStack_1340;
  local_d8 = local_1254;
  local_d4 = local_1254;
  local_d0 = local_1254;
  local_cc = local_1254;
  local_c8 = local_1358;
  uStack_c0 = uStack_1350;
  local_b8 = local_1258;
  local_b4 = local_1258;
  local_b0 = local_1258;
  local_ac = local_1258;
  local_a8 = local_1368;
  uStack_a0 = uStack_1360;
  local_98 = local_125c;
  local_94 = local_125c;
  local_90 = local_125c;
  local_8c = local_125c;
  local_88 = local_1378;
  uStack_80 = uStack_1370;
  local_78 = local_1260;
  local_74 = local_1260;
  local_70 = local_1260;
  local_6c = local_1260;
  local_68 = local_1388;
  uStack_60 = uStack_1380;
  local_58 = local_1264;
  local_54 = local_1264;
  local_50 = local_1264;
  local_4c = local_1264;
  local_48 = local_1398;
  uStack_40 = uStack_1390;
  local_38 = local_1268;
  local_34 = local_1268;
  local_30 = local_1268;
  local_2c = local_1268;
  local_28 = local_13a8;
  uStack_20 = uStack_13a0;
  local_10 = local_126c;
  local_c = local_126c;
  local_8 = local_126c;
  local_4 = local_126c;
  iadst16_stage3_ssse3(x_00);
  __rounding_02[0]._2_2_ = uVar161;
  __rounding_02[0]._0_2_ = uVar160;
  __rounding_02[0]._4_2_ = uVar162;
  __rounding_02[0]._6_2_ = uVar163;
  __rounding_02[1]._0_2_ = uVar164;
  __rounding_02[1]._2_2_ = uVar165;
  __rounding_02[1]._4_2_ = uVar166;
  __rounding_02[1]._6_2_ = uVar167;
  iadst16_stage4_ssse3
            ((__m128i *)CONCAT44(iVar156,iVar155),(int32_t *)CONCAT44(iVar154,iVar144),__rounding_02
             ,cos_bit_02);
  iadst16_stage5_ssse3(x_00);
  __rounding_01[1] = (longlong)cospi_00;
  __rounding_01[0] = lVar159;
  iadst16_stage6_ssse3(auVar149._0_8_,(int32_t *)x_01,__rounding_01,cos_bit_01);
  iadst16_stage7_ssse3(x_00);
  __rounding_00[1]._0_7_ = uVar158;
  __rounding_00[0] = uVar157;
  __rounding_00[1]._7_1_ = cos_bit_01;
  iadst16_stage8_ssse3(x_01,cospi_00,__rounding_00,cos_bit_00);
  iadst16_stage9_ssse3(local_1280,&local_14a8);
  return;
}

Assistant:

static void iadst16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3~9
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}